

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS
ref_migrate_split_dir(REF_MPI ref_mpi,REF_INT n,REF_DBL *xyz,REF_DBL *transform,REF_INT *dir)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  REF_DBL *pRVar5;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REF_DBL temp;
  REF_DBL maxes [3];
  REF_DBL mins [3];
  REF_DBL transformed [3];
  
  *dir = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    mins[lVar2] = 1e+200;
    maxes[lVar2] = -1e+200;
  }
  uVar4 = 0;
  uVar7 = (ulong)(uint)n;
  if (n < 1) {
    uVar7 = uVar4;
  }
  for (; uVar4 != uVar7; uVar4 = uVar4 + 1) {
    uVar1 = ref_matrix_ax(3,transform,xyz + uVar4 * 3,transformed);
    if (uVar1 != 0) {
      pcVar6 = "ax";
      uVar3 = 0x162;
      goto LAB_001fde73;
    }
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar8 = transformed[lVar2];
      dVar9 = mins[lVar2];
      if (dVar8 <= mins[lVar2]) {
        dVar9 = dVar8;
      }
      mins[lVar2] = dVar9;
      dVar9 = maxes[lVar2];
      if (maxes[lVar2] <= dVar8) {
        dVar9 = dVar8;
      }
      maxes[lVar2] = dVar9;
    }
  }
  lVar2 = 0;
  do {
    if (lVar2 == 0x18) {
      dVar8 = maxes[0] - mins[0];
      dVar9 = maxes[1] - mins[1];
      dVar10 = maxes[2] - mins[2];
      if ((dVar9 < dVar8 || dVar9 < dVar10) && (dVar8 > dVar10 || dVar9 > dVar10)) {
        return 0;
      }
      *dir = (dVar8 <= dVar10 && dVar9 <= dVar10) + 1;
      return 0;
    }
    pRVar5 = (REF_DBL *)((long)mins + lVar2);
    temp = *pRVar5;
    uVar1 = ref_mpi_min(ref_mpi,&temp,pRVar5,3);
    if (uVar1 != 0) {
      pcVar6 = "min";
      uVar3 = 0x16a;
      goto LAB_001fde73;
    }
    uVar1 = ref_mpi_bcast(ref_mpi,pRVar5,1,3);
    if (uVar1 != 0) {
      pcVar6 = "bcast";
      uVar3 = 0x16b;
      goto LAB_001fde73;
    }
    pRVar5 = (REF_DBL *)((long)maxes + lVar2);
    temp = *pRVar5;
    uVar1 = ref_mpi_max(ref_mpi,&temp,pRVar5,3);
    if (uVar1 != 0) {
      pcVar6 = "max";
      uVar3 = 0x16d;
      goto LAB_001fde73;
    }
    uVar1 = ref_mpi_bcast(ref_mpi,pRVar5,1,3);
    lVar2 = lVar2 + 8;
  } while (uVar1 == 0);
  pcVar6 = "bcast";
  uVar3 = 0x16e;
LAB_001fde73:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar3,
         "ref_migrate_split_dir",(ulong)uVar1,pcVar6);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_split_dir(REF_MPI ref_mpi, REF_INT n,
                                         REF_DBL *xyz, REF_DBL *transform,
                                         REF_INT *dir) {
  REF_DBL mins[3], maxes[3], temp, transformed[3];
  REF_INT i, j;
  *dir = 0;
  for (j = 0; j < 3; j++) {
    mins[j] = REF_DBL_MAX;
    maxes[j] = REF_DBL_MIN;
  }
  for (i = 0; i < n; i++) {
    RSS(ref_matrix_ax(3, transform, &(xyz[3 * i]), transformed), "ax");
    for (j = 0; j < 3; j++) {
      mins[j] = MIN(mins[j], transformed[j]);
      maxes[j] = MAX(maxes[j], transformed[j]);
    }
  }
  for (j = 0; j < 3; j++) {
    temp = mins[j];
    RSS(ref_mpi_min(ref_mpi, &temp, &(mins[j]), REF_DBL_TYPE), "min");
    RSS(ref_mpi_bcast(ref_mpi, &(mins[j]), 1, REF_DBL_TYPE), "bcast");
    temp = maxes[j];
    RSS(ref_mpi_max(ref_mpi, &temp, &(maxes[j]), REF_DBL_TYPE), "max");
    RSS(ref_mpi_bcast(ref_mpi, &(maxes[j]), 1, REF_DBL_TYPE), "bcast");
  }
  if ((maxes[1] - mins[1]) >= (maxes[0] - mins[0]) &&
      (maxes[1] - mins[1]) >= (maxes[2] - mins[2]))
    *dir = 1;
  if ((maxes[2] - mins[2]) >= (maxes[0] - mins[0]) &&
      (maxes[2] - mins[2]) >= (maxes[1] - mins[1]))
    *dir = 2;

  return REF_SUCCESS;
}